

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsi-timeout.c
# Opt level: O3

void lws_sul_wsitimeout_cb(lws_sorted_usec_list_t *sul)

{
  lws_dll2 **wsi;
  byte *pbVar1;
  char cVar2;
  short sVar3;
  lws_dll2 *plVar4;
  lws_log_cx *cx;
  
  wsi = &sul[-8].list.next;
  if (*(char *)((long)&sul[0x10].list.next + 4) != ' ') {
    plVar4 = sul[-8].list.next;
    cVar2 = *(char *)((long)&sul[0x10].list.next + 5);
    cx = lwsl_wsi_get_cx((lws *)wsi);
    _lws_log_cx(cx,lws_log_prepend_wsi,wsi,8,"lws_sul_wsitimeout_cb",
                "TIMEDOUT WAITING %d, dhdr %d, ah %p, wl %d",
                (ulong)(uint)(int)*(char *)((long)&sul[0x10].list.next + 4),
                (ulong)(*(uint *)((long)&sul[0xf].cb + 6) & 1),sul[-7].us,
                (ulong)*(uint *)((long)plVar4 + (long)cVar2 * 0x1a0 + 1000));
    if (*(char *)((long)&sul[0x10].list.next + 4) == '\x0f') goto LAB_00118491;
  }
  pbVar1 = (byte *)((long)&sul[0xf].cb + 7);
  *pbVar1 = *pbVar1 | 0x10;
LAB_00118491:
  sVar3 = *(short *)((long)&sul[0xf].list.next + 4);
  if (sVar3 == 0x204) {
    lws_inform_client_conn_fail((lws *)wsi,"Timed out waiting SSL",0x15);
    sVar3 = *(short *)((long)&sul[0xf].list.next + 4);
  }
  if (sVar3 == 0x20b) {
    lws_inform_client_conn_fail((lws *)wsi,"Timed out waiting server reply",0x1e);
  }
  __lws_close_free_wsi((lws *)wsi,LWS_CLOSE_STATUS_NOSTATUS,"timeout");
  return;
}

Assistant:

static void
lws_sul_wsitimeout_cb(lws_sorted_usec_list_t *sul)
{
	struct lws *wsi = lws_container_of(sul, struct lws, sul_timeout);
	struct lws_context *cx = wsi->a.context;
	struct lws_context_per_thread *pt = &cx->pt[(int)wsi->tsi];

	/* no need to log normal idle keepalive timeout */
//		if (wsi->pending_timeout != PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE)
#if defined(LWS_ROLE_H1) || defined(LWS_ROLE_H2)
	if (wsi->pending_timeout != PENDING_TIMEOUT_USER_OK)
		lwsl_wsi_info(wsi, "TIMEDOUT WAITING %d, dhdr %d, ah %p, wl %d",
				   wsi->pending_timeout,
				   wsi->hdr_parsing_completed, wsi->http.ah,
				   pt->http.ah_wait_list_length);
#if defined(LWS_WITH_CGI)
	if (wsi->http.cgi)
		lwsl_wsi_notice(wsi, "CGI timeout: %s", wsi->http.cgi->summary);
#endif
#else
	if (wsi->pending_timeout != PENDING_TIMEOUT_USER_OK)
		lwsl_wsi_info(wsi, "TIMEDOUT WAITING on %d ",
				   wsi->pending_timeout);
#endif
	/* cgi timeout */
	if (wsi->pending_timeout != PENDING_TIMEOUT_HTTP_KEEPALIVE_IDLE)
		/*
		 * Since he failed a timeout, he already had a chance to
		 * do something and was unable to... that includes
		 * situations like half closed connections.  So process
		 * this "failed timeout" close as a violent death and
		 * don't try to do protocol cleanup like flush partials.
		 */
		wsi->socket_is_permanently_unusable = 1;
#if defined(LWS_WITH_CLIENT)
	if (lwsi_state(wsi) == LRS_WAITING_SSL)
		lws_inform_client_conn_fail(wsi,
			(void *)"Timed out waiting SSL", 21);
	if (lwsi_state(wsi) == LRS_WAITING_SERVER_REPLY)
		lws_inform_client_conn_fail(wsi,
			(void *)"Timed out waiting server reply", 30);
#endif

	lws_context_lock(cx, __func__);
	lws_pt_lock(pt, __func__);
	__lws_close_free_wsi(wsi, LWS_CLOSE_STATUS_NOSTATUS, "timeout");
	lws_pt_unlock(pt);
	lws_context_unlock(cx);
}